

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_CutDeref_rec(Of_Man_t *p,int *pCut)

{
  int iVar1;
  uint iObj;
  int iVar2;
  int *piVar3;
  uint v;
  
  if ((p->Iter & 1) == 0) {
    iVar1 = 0;
    if (1 < (*pCut & 0x1fU)) {
      iVar1 = (*pCut & 0x1fU) + p->pPars->nAreaTuner;
    }
  }
  else {
    iVar1 = 1;
  }
  v = 0;
  while( true ) {
    if ((*pCut & 0x1fU) <= v) {
      return iVar1;
    }
    iObj = Of_CutVar(pCut,v);
    if (iObj == 0) break;
    if (p->pObjs[iObj].iCutH != 0) {
      piVar3 = &p->pObjs[iObj].nRefs;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        piVar3 = Of_ObjCutBestP(p,iObj);
        iVar2 = Of_CutDeref_rec(p,piVar3);
        iVar1 = iVar1 + iVar2;
      }
    }
    v = v + 1;
  }
  return iVar1;
}

Assistant:

int Of_CutDeref_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
        if ( Of_ObjCutBest(p, Var) && !Of_ObjRefDec(p, Var) )
            Count += Of_CutDeref_rec( p, Of_ObjCutBestP(p, Var) );
    return Count;
}